

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_fetch(Curl_easy *data)

{
  IMAP *pIVar1;
  char *local_88;
  char *local_70;
  char *local_58;
  char *local_40;
  IMAP *imap;
  CURLcode result;
  Curl_easy *data_local;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1->uid == (char *)0x0) {
    if (pIVar1->mindex == (char *)0x0) {
      Curl_failf(data,"Cannot FETCH without a UID.");
      return CURLE_URL_MALFORMAT;
    }
    if (pIVar1->partial == (char *)0x0) {
      if (pIVar1->section == (char *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = pIVar1->section;
      }
      imap._4_4_ = imap_sendf(data,"FETCH %s BODY[%s]",pIVar1->mindex,local_88);
    }
    else {
      if (pIVar1->section == (char *)0x0) {
        local_70 = "";
      }
      else {
        local_70 = pIVar1->section;
      }
      imap._4_4_ = imap_sendf(data,"FETCH %s BODY[%s]<%s>",pIVar1->mindex,local_70,pIVar1->partial);
    }
  }
  else if (pIVar1->partial == (char *)0x0) {
    if (pIVar1->section == (char *)0x0) {
      local_58 = "";
    }
    else {
      local_58 = pIVar1->section;
    }
    imap._4_4_ = imap_sendf(data,"UID FETCH %s BODY[%s]",pIVar1->uid,local_58);
  }
  else {
    if (pIVar1->section == (char *)0x0) {
      local_40 = "";
    }
    else {
      local_40 = pIVar1->section;
    }
    imap._4_4_ = imap_sendf(data,"UID FETCH %s BODY[%s]<%s>",pIVar1->uid,local_40,pIVar1->partial);
  }
  if (imap._4_4_ == CURLE_OK) {
    imap_state(data,IMAP_FETCH);
  }
  return imap._4_4_;
}

Assistant:

static CURLcode imap_perform_fetch(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;
  /* Check we have a UID */
  if(imap->uid) {

    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(data, "UID FETCH %s BODY[%s]<%s>",
                          imap->uid, imap->section ? imap->section : "",
                          imap->partial);
    else
      result = imap_sendf(data, "UID FETCH %s BODY[%s]",
                          imap->uid, imap->section ? imap->section : "");
  }
  else if(imap->mindex) {
    /* Send the FETCH command */
    if(imap->partial)
      result = imap_sendf(data, "FETCH %s BODY[%s]<%s>",
                          imap->mindex, imap->section ? imap->section : "",
                          imap->partial);
    else
      result = imap_sendf(data, "FETCH %s BODY[%s]",
                          imap->mindex, imap->section ? imap->section : "");
  }
  else {
    failf(data, "Cannot FETCH without a UID.");
    return CURLE_URL_MALFORMAT;
  }
  if(!result)
    imap_state(data, IMAP_FETCH);

  return result;
}